

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testMatchAlphabet(diff_match_patch_test *this)

{
  wstring *pwVar1;
  map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> bitmask;
  allocator<wchar_t> local_ca;
  allocator<wchar_t> local_c9;
  wstring local_c8;
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  local_a8;
  wstring local_70 [32];
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  local_50;
  
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl._0_4_ = 0x61;
  local_c8._M_dataplus._M_p._0_4_ = 4;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 0x62;
  local_c8._M_dataplus._M_p._0_4_ = 2;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 99;
  local_c8._M_dataplus._M_p._0_4_ = 1;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_c8,L"match_alphabet: Unique.",&local_c9);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_70,L"abc",&local_ca);
  pwVar1 = (wstring *)&local_a8;
  diff_match_patch::match_alphabet(pwVar1);
  assertEquals((diff_match_patch_test *)pwVar1,&local_c8,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_50,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_a8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  std::__cxx11::wstring::~wstring(local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_c8);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::operator=(&local_50,&local_a8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  local_a8._M_impl._0_4_ = 0x61;
  local_c8._M_dataplus._M_p._0_4_ = 0x25;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 0x62;
  local_c8._M_dataplus._M_p._0_4_ = 0x12;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  local_a8._M_impl._0_4_ = 99;
  local_c8._M_dataplus._M_p._0_4_ = 8;
  std::
  _Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
  ::_M_emplace_unique<wchar_t,int>
            ((_Rb_tree<wchar_t,std::pair<wchar_t_const,int>,std::_Select1st<std::pair<wchar_t_const,int>>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,int>>>
              *)&local_50,(wchar_t *)&local_a8,(int *)&local_c8);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_c8,L"match_alphabet: Duplicates.",&local_c9);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_70,L"abcaba",&local_ca);
  pwVar1 = (wstring *)&local_a8;
  diff_match_patch::match_alphabet(pwVar1);
  assertEquals((diff_match_patch_test *)pwVar1,&local_c8,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_50,
               (map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
                *)&local_a8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_a8);
  std::__cxx11::wstring::~wstring(local_70);
  std::__cxx11::wstring::~wstring((wstring *)&local_c8);
  std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void diff_match_patch_test::testMatchAlphabet() {
  // Initialise the bitmasks for Bitap.
  std::map<wchar_t, int> bitmask;
  bitmask.emplace(L'a', 4);
  bitmask.emplace(L'b', 2);
  bitmask.emplace(L'c', 1);
  assertEquals(L"match_alphabet: Unique.", bitmask, dmp.match_alphabet(L"abc"));

  bitmask = std::map<wchar_t, int>();
  bitmask.emplace(L'a', 37);
  bitmask.emplace(L'b', 18);
  bitmask.emplace(L'c', 8);
  assertEquals(L"match_alphabet: Duplicates.", bitmask, dmp.match_alphabet(L"abcaba"));
}